

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_options.h
# Opt level: O3

bool __thiscall
draco::DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
          (DracoOptions<draco::GeometryAttribute::Type> *this,AttributeKey *att_key,string *name,
          bool default_val)

{
  _Rb_tree_header *p_Var1;
  AttributeKey AVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  DracoOptions<draco::GeometryAttribute::Type> *this_00;
  
  p_Var4 = (this->attribute_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->attribute_options_)._M_t._M_impl.super__Rb_tree_header;
    AVar2 = *att_key;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (AVar2 <= (int)p_Var4[1]._M_color) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < AVar2];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && ((int)p_Var6[1]._M_color <= AVar2)) {
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&p_Var6[1]._M_parent,name);
      this_00 = (DracoOptions<draco::GeometryAttribute::Type> *)&p_Var6[1]._M_parent;
      if (cVar5._M_node != (_Base_ptr)&p_Var6[1]._M_left) goto LAB_00141867;
    }
  }
  this_00 = this;
LAB_00141867:
  bVar3 = Options::GetBool(&this_00->global_options_,name,default_val);
  return bVar3;
}

Assistant:

bool DracoOptions<AttributeKeyT>::GetAttributeBool(const AttributeKeyT &att_key,
                                                   const std::string &name,
                                                   bool default_val) const {
  const Options *const att_options = FindAttributeOptions(att_key);
  if (att_options && att_options->IsOptionSet(name)) {
    return att_options->GetBool(name, default_val);
  }
  return global_options_.GetBool(name, default_val);
}